

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags extra_flags)

{
  bool bVar1;
  ImGuiID id_00;
  bool is_open;
  ImGuiWindowFlags flags;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindowFlags extra_flags_local;
  bool *p_open_local;
  char *name_local;
  
  id_00 = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  bVar1 = IsPopupOpen(id_00);
  if (bVar1) {
    name_local._7_1_ = Begin(name,p_open,extra_flags | 0x6000120);
    if ((!name_local._7_1_) || ((p_open != (bool *)0x0 && ((*p_open & 1U) == 0)))) {
      EndPopup();
      if (name_local._7_1_) {
        ClosePopup(id_00);
      }
      name_local._7_1_ = false;
    }
  }
  else {
    ClearSetNextWindowData();
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id))
    {
        ClearSetNextWindowData(); // We behave like Begin() and need to consume those values
        return false;
    }

    ImGuiWindowFlags flags = extra_flags|ImGuiWindowFlags_Popup|ImGuiWindowFlags_Modal|ImGuiWindowFlags_NoCollapse|ImGuiWindowFlags_NoSavedSettings;
    bool is_open = ImGui::Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        ImGui::EndPopup();
        if (is_open)
            ClosePopup(id);
        return false;
    }

    return is_open;
}